

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.c
# Opt level: O2

void wprefs(settings_w *sesskey,char *name,keyvalwhere *mapping,int nvals,Conf *conf,int primary)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char *value;
  char *pcVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  iVar8 = 0;
  iVar7 = 0;
  if (0 < nvals) {
    iVar7 = nvals;
  }
  for (iVar6 = 0; iVar7 != iVar6; iVar6 = iVar6 + 1) {
    iVar2 = conf_get_int_int(conf,primary,iVar6);
    pcVar3 = val2key(mapping,nvals,iVar2);
    if (pcVar3 != (char *)0x0) {
      sVar4 = strlen(pcVar3);
      iVar8 = iVar8 + (uint)(0 < iVar8) + (int)sVar4;
    }
  }
  value = (char *)safemalloc((long)(iVar8 + 1),1,0);
  pcVar3 = value;
  for (iVar6 = 0; iVar7 != iVar6; iVar6 = iVar6 + 1) {
    iVar2 = conf_get_int_int(conf,primary,iVar6);
    pcVar5 = val2key(mapping,nvals,iVar2);
    if (pcVar5 != (char *)0x0) {
      pcVar1 = " \t";
      if (value < pcVar3) {
        pcVar1 = "%s,";
      }
      iVar2 = sprintf(pcVar3,"%s%s",pcVar1 + 2,pcVar5);
      pcVar3 = pcVar3 + iVar2;
    }
  }
  if ((long)pcVar3 - (long)value == (long)iVar8) {
    *pcVar3 = '\0';
    write_setting_s(sesskey,name,value);
    safefree(value);
    return;
  }
  __assert_fail("p - buf == maxlen",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/settings.c",0x1d5
                ,
                "void wprefs(settings_w *, const char *, const struct keyvalwhere *, int, Conf *, int)"
               );
}

Assistant:

static void wprefs(settings_w *sesskey, const char *name,
                   const struct keyvalwhere *mapping, int nvals,
                   Conf *conf, int primary)
{
    char *buf, *p;
    int i, maxlen;

    for (maxlen = i = 0; i < nvals; i++) {
        const char *s = val2key(mapping, nvals,
                                conf_get_int_int(conf, primary, i));
        if (s) {
            maxlen += (maxlen > 0 ? 1 : 0) + strlen(s);
        }
    }

    buf = snewn(maxlen + 1, char);
    p = buf;

    for (i = 0; i < nvals; i++) {
        const char *s = val2key(mapping, nvals,
                                conf_get_int_int(conf, primary, i));
        if (s) {
            p += sprintf(p, "%s%s", (p > buf ? "," : ""), s);
        }
    }

    assert(p - buf == maxlen);
    *p = '\0';

    write_setting_s(sesskey, name, buf);

    sfree(buf);
}